

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlMaster.cpp
# Opt level: O2

EbmlElement * __thiscall libebml::EbmlMaster::AddNewElt(EbmlMaster *this,EbmlCallbacks *Callbacks)

{
  EbmlElement *element;
  
  element = (*Callbacks->Create)();
  PushElement(this,element);
  return element;
}

Assistant:

EbmlElement *EbmlMaster::AddNewElt(const EbmlCallbacks & Callbacks)
{
  // add the element
  EbmlElement *NewElt = &EBML_INFO_CREATE(Callbacks);
  if (NewElt == NULL)
    return NULL;

  if (!PushElement(*NewElt)) {
    delete NewElt;
    NewElt = NULL;
  }
  return NewElt;
}